

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.cpp
# Opt level: O2

string * duckdb::PrettyPrintString(string *__return_storage_ptr__,string *s)

{
  byte bVar1;
  pointer pcVar2;
  size_type sVar3;
  char cVar4;
  size_type sVar5;
  allocator local_31;
  
  ::std::__cxx11::string::string
            ((string *)__return_storage_ptr__,anon_var_dwarf_3b6586a + 9,&local_31);
  pcVar2 = (s->_M_dataplus)._M_p;
  sVar3 = s->_M_string_length;
  for (sVar5 = 0; sVar3 != sVar5; sVar5 = sVar5 + 1) {
    bVar1 = pcVar2[sVar5];
    cVar4 = (char)__return_storage_ptr__;
    if ((((byte)(bVar1 - 0x30) < 10) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) ||
       ((bVar1 - 0x20 < 0x40 && ((0x8000000000006001U >> ((ulong)(bVar1 - 0x20) & 0x3f) & 1) != 0)))
       ) {
      ::std::__cxx11::string::push_back(cVar4);
    }
    else {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      ::std::__cxx11::string::push_back(cVar4);
      ::std::__cxx11::string::push_back(cVar4);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static string PrettyPrintString(const string &s) {
	string res = "";
	for (auto c : s) {
		if (StringUtil::CharacterIsAlpha(c) || StringUtil::CharacterIsDigit(c) || c == '_' || c == '-' || c == ' ' ||
		    c == '.') {
			res += c;
		} else {
			auto value = UnsafeNumericCast<uint8_t>(c);
			res += "\\x";
			uint8_t first = value / 16;
			if (first < 10) {
				res.push_back((char)('0' + first));
			} else {
				res.push_back((char)('a' + first - 10));
			}
			uint8_t second = value % 16;
			if (second < 10) {
				res.push_back((char)('0' + second));
			} else {
				res.push_back((char)('a' + second - 10));
			}
		}
	}
	return res;
}